

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O3

int m256v_row_iszero(m256v *M,int r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (ulong)M->n_col;
  if ((long)uVar3 < 1) {
    return 1;
  }
  lVar4 = (long)r * M->rstride;
  if (M->e[lVar4] != '\0') {
    return 0;
  }
  uVar1 = 1;
  do {
    uVar2 = uVar1;
    if (uVar3 == uVar2) break;
    uVar1 = uVar2 + 1;
  } while (M->e[uVar2 + lVar4] == '\0');
  return (int)(uVar3 <= uVar2);
}

Assistant:

int m256v_row_iszero(const m256v* M, int r)
{
	for (int c = 0; c < M->n_col; ++c) {
		if (get_el(M, r, c) != 0) {
			return 0;
		}
	}
	return 1;
}